

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OBJReader.cc
# Opt level: O0

void __thiscall OpenMesh::IO::_OBJReader_::_OBJReader_(_OBJReader_ *this)

{
  _IOManager_ *this_00;
  _OBJReader_ *this_local;
  
  BaseReader::BaseReader(&this->super_BaseReader);
  (this->super_BaseReader)._vptr_BaseReader = (_func_int **)&PTR___OBJReader__003de080;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMesh::IO::_OBJReader_::Material,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMesh::IO::_OBJReader_::Material>_>_>
  ::map(&this->materials_);
  std::__cxx11::string::string((string *)&this->path_);
  this_00 = IOManager();
  _IOManager_::register_module(this_00,&this->super_BaseReader);
  return;
}

Assistant:

_OBJReader_::
_OBJReader_()
{
  IOManager().register_module(this);
}